

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

void Abc_NtkOrderCisCos(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int local_28;
  int local_24;
  int k;
  int i;
  Abc_Obj_t *pTerm;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  Vec_PtrClear(pNtk->vCis);
  Vec_PtrClear(pNtk->vCos);
  for (local_24 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkPi(pNtk,local_24);
    Vec_PtrPush(pNtk->vCis,pAVar2);
  }
  for (local_24 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkPo(pNtk,local_24);
    Vec_PtrPush(pNtk->vCos,pAVar2);
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkBox(pNtk,local_24);
    iVar1 = Abc_ObjIsLatch(pAVar2);
    if (iVar1 == 0) {
      for (local_28 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_28 < iVar1; local_28 = local_28 + 1)
      {
        pAVar3 = Abc_ObjFanin(pAVar2,local_28);
        Vec_PtrPush(pNtk->vCos,pAVar3);
      }
      for (local_28 = 0; iVar1 = Abc_ObjFanoutNum(pAVar2), local_28 < iVar1; local_28 = local_28 + 1
          ) {
        pAVar3 = Abc_ObjFanout(pAVar2,local_28);
        Vec_PtrPush(pNtk->vCis,pAVar3);
      }
    }
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkBox(pNtk,local_24);
    iVar1 = Abc_ObjIsLatch(pAVar2);
    if (iVar1 != 0) {
      for (local_28 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_28 < iVar1; local_28 = local_28 + 1)
      {
        pAVar3 = Abc_ObjFanin(pAVar2,local_28);
        Vec_PtrPush(pNtk->vCos,pAVar3);
      }
      for (local_28 = 0; iVar1 = Abc_ObjFanoutNum(pAVar2), local_28 < iVar1; local_28 = local_28 + 1
          ) {
        pAVar3 = Abc_ObjFanout(pAVar2,local_28);
        Vec_PtrPush(pNtk->vCis,pAVar3);
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkOrderCisCos( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pTerm;
    int i, k;
    Vec_PtrClear( pNtk->vCis );
    Vec_PtrClear( pNtk->vCos );
    Abc_NtkForEachPi( pNtk, pObj, i )
        Vec_PtrPush( pNtk->vCis, pObj );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Vec_PtrPush( pNtk->vCos, pObj );
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( Abc_ObjIsLatch(pObj) )
            continue;
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Vec_PtrPush( pNtk->vCos, pTerm );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Vec_PtrPush( pNtk->vCis, pTerm );
    }
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( !Abc_ObjIsLatch(pObj) )
            continue;
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Vec_PtrPush( pNtk->vCos, pTerm );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Vec_PtrPush( pNtk->vCis, pTerm );
    }
}